

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

uoffset64_t __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::ReferTo(FlatBufferBuilderImpl<true> *this,uoffset64_t off)

{
  ulong uVar1;
  
  if (this->minalign_ < 8) {
    this->minalign_ = 8;
  }
  vector_downward<unsigned_long>::fill(&this->buf_,(ulong)(-(int)(this->buf_).size_ & 7));
  uVar1 = (this->buf_).size_;
  if (off - 1 < uVar1) {
    return (uVar1 - off) + 8;
  }
  __assert_fail("off && off <= size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                ,0x185,
                "T flatbuffers::FlatBufferBuilderImpl<true>::ReferTo(const T, const T) [Is64Aware = true, T = unsigned long]"
               );
}

Assistant:

uoffset64_t ReferTo(uoffset64_t off) {
    // Align to ensure GetSize() below is correct.
    Align(sizeof(uoffset64_t));
    // 64-bit offsets are relative to tail of the whole buffer
    return ReferTo(off, GetSize());
  }